

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionRule>::reallocate
          (QPodArrayOps<QTzTransitionRule> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  QTzTransitionRule *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QTzTransitionRule>_*,_QTzTransitionRule_*> pVar2;
  pair<QTypedArrayData<QTzTransitionRule>_*,_QTzTransitionRule_*> pair;
  QTzTransitionRule *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QTzTransitionRule>::reallocateUnaligned
                    ((QTypedArrayData<QTzTransitionRule> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,
                     in_EDX);
  local_10 = pVar2.second;
  if (local_10 == (QTzTransitionRule *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    *(QTypedArrayData<QTzTransitionRule> **)in_RDI = pVar2.first;
    *(QTzTransitionRule **)&in_RDI->abbreviationIndex = local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }